

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

int sftp_cmd_close(sftp_command *cmd)

{
  _Bool _Var1;
  char local_19;
  sftp_command *psStack_18;
  char ch;
  sftp_command *cmd_local;
  
  psStack_18 = cmd;
  if (backend == (Backend *)0x0) {
    not_connected();
  }
  else {
    _Var1 = backend_connected(backend);
    if (_Var1) {
      backend_special(backend,SS_EOF,0);
      sent_eof = true;
      sftp_recvdata(&local_19,1);
    }
    do_sftp_cleanup();
  }
  return 0;
}

Assistant:

int sftp_cmd_close(struct sftp_command *cmd)
{
    if (!backend) {
        not_connected();
        return 0;
    }

    if (backend_connected(backend)) {
        char ch;
        backend_special(backend, SS_EOF, 0);
        sent_eof = true;
        sftp_recvdata(&ch, 1);
    }
    do_sftp_cleanup();

    return 0;
}